

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall IfStatement::print(IfStatement *this)

{
  IfStatement *pIVar1;
  ExprNode *pEVar2;
  int iVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"if ",3);
  (**this->_cond->_vptr_ExprNode)();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
  Statements::print(this->_stmts);
  for (pIVar1 = this->_elif; pIVar1 != (IfStatement *)0x0; pIVar1 = pIVar1->_elif) {
    pEVar2 = pIVar1->_cond;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    if (pEVar2 == (ExprNode *)0x0) {
      if (0 < (this->super_Statement).indentState) {
        iVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar3 = iVar3 + 1;
        } while (iVar3 < (this->super_Statement).indentState);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"else",4);
    }
    else {
      if (0 < (this->super_Statement).indentState) {
        iVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
          iVar3 = iVar3 + 1;
        } while (iVar3 < (this->super_Statement).indentState);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"elif ",5);
      (**pIVar1->_cond->_vptr_ExprNode)();
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    Statements::print(pIVar1->_stmts);
  }
  return;
}

Assistant:

void IfStatement::print() {
    //std::cout << "Printing If Statement...\n";
    std::cout << "if "; _cond->print(); std::cout << ":";
    _stmts->print();
    IfStatement* next = _elif;
    while(next != nullptr) {
        if (next->_cond == nullptr){
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "else";
        } else {
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "elif "; next->_cond->print();
        }
        std::cout << ":";
        next->_stmts->print();
        next = next->_elif;
    }
//    std::vector<std::pair<ExprNode*,Statements*>>testsAndSuites = getTestsAndSuites();
//    for(int i = 0; i < testsAndSuites.size();i++){
//        if(i == 0) {
//            std::cout << "if ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else if( testsAndSuites[i].first == nullptr) {
//            std::cout << "else ";
//            std::cout << " : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else{
//            std::cout << "elif ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//    }
}